

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O2

bool __thiscall CMutableTransaction::HasWitness(CMutableTransaction *this)

{
  _Vector_impl_data *p_Var1;
  pointer pCVar2;
  pointer pvVar3;
  ulong uVar4;
  ulong uVar5;
  pointer *ppvVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  pCVar2 = (this->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pCVar2) / 0x68;
  ppvVar6 = (pointer *)((long)&(pCVar2->scriptWitness).stack + 8);
  uVar4 = 0;
  do {
    uVar7 = uVar4;
    if (uVar5 == uVar7) break;
    p_Var1 = (_Vector_impl_data *)(ppvVar6 + -1);
    pvVar3 = *ppvVar6;
    ppvVar6 = ppvVar6 + 0xd;
    uVar4 = uVar7 + 1;
  } while (p_Var1->_M_start == pvVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar7 < uVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool HasWitness() const
    {
        for (size_t i = 0; i < vin.size(); i++) {
            if (!vin[i].scriptWitness.IsNull()) {
                return true;
            }
        }
        return false;
    }